

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int mbedtls_x509_crt_parse_der(mbedtls_x509_crt *chain,uchar *buf,size_t buflen)

{
  int *val;
  mbedtls_x509_sequence *pmVar1;
  mbedtls_x509_sequence *cur;
  byte bVar2;
  size_t __n;
  int iVar3;
  int iVar4;
  mbedtls_x509_crt *pmVar5;
  mbedtls_x509_crt *pmVar6;
  uchar *__dest;
  size_t sVar7;
  mbedtls_asn1_sequence *pmVar8;
  ulong uVar9;
  mbedtls_x509_crt *pmVar10;
  uint uVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *local_138;
  mbedtls_x509_crt *local_130;
  byte *local_128;
  int local_11c;
  int *local_118;
  size_t len;
  mbedtls_asn1_sequence *local_108;
  uint local_100;
  int is_critical;
  size_t len_2;
  uchar uStack_f0;
  undefined7 uStack_ef;
  byte *local_e8;
  int *local_d8;
  byte *local_d0;
  size_t len_1;
  size_t local_c0;
  mbedtls_x509_buf extn_oid;
  mbedtls_x509_buf sig_params1;
  mbedtls_x509_buf local_68;
  mbedtls_x509_buf sig_params2;
  
  if (buf == (uchar *)0x0 || chain == (mbedtls_x509_crt *)0x0) {
    return -0x2800;
  }
  pmVar5 = (mbedtls_x509_crt *)0x0;
  pmVar6 = chain;
  do {
    pmVar10 = pmVar6;
    if (pmVar10->version == 0) goto LAB_0010c238;
    pmVar5 = pmVar10;
    pmVar6 = pmVar10->next;
  } while (pmVar10->next != (mbedtls_x509_crt *)0x0);
  pmVar6 = (mbedtls_x509_crt *)calloc(1,0x228);
  pmVar10->next = pmVar6;
  if (pmVar6 == (mbedtls_x509_crt *)0x0) {
    return -0x2880;
  }
  memset(pmVar6,0,0x228);
  pmVar10 = pmVar10->next;
LAB_0010c238:
  sig_params1.tag = 0;
  sig_params1._4_4_ = 0;
  sig_params1.len = 0;
  sig_params1.p = (uchar *)0x0;
  sig_params2.tag = 0;
  sig_params2._4_4_ = 0;
  sig_params2.len = 0;
  sig_params2.p = (uchar *)0x0;
  local_68.tag = 0;
  local_68._4_4_ = 0;
  local_68.len = 0;
  local_68.p = (uchar *)0x0;
  if (pmVar10 == (mbedtls_x509_crt *)0x0) {
    iVar3 = -0x2800;
    goto LAB_0010c434;
  }
  local_138 = buf;
  len = buflen;
  iVar3 = mbedtls_asn1_get_tag(&local_138,buf + buflen,&len,0x30);
  sVar7 = len;
  if (iVar3 != 0) {
    mbedtls_x509_crt_free(pmVar10);
    iVar3 = -0x2180;
    goto LAB_0010c434;
  }
  local_130 = pmVar10;
  if ((ulong)((long)(buf + buflen) - (long)local_138) < len) goto LAB_0010c2c7;
  pbVar13 = local_138 + (len - (long)buf);
  (pmVar10->raw).len = (size_t)pbVar13;
  __dest = (uchar *)calloc(1,(size_t)pbVar13);
  (pmVar10->raw).p = __dest;
  if (__dest == (uchar *)0x0) {
    iVar3 = -0x2880;
    goto LAB_0010c434;
  }
  memcpy(__dest,buf,(size_t)pbVar13);
  local_138 = __dest + ((long)pbVar13 - sVar7);
  (pmVar10->tbs).p = local_138;
  iVar3 = mbedtls_asn1_get_tag(&local_138,__dest + (long)pbVar13,&len,0x30);
  if (iVar3 != 0) {
LAB_0010c34e:
    mbedtls_x509_crt_free(pmVar10);
    iVar3 = iVar3 + -0x2180;
    if (iVar3 == 0) {
      return 0;
    }
    goto LAB_0010c434;
  }
  pbVar12 = local_138 + len;
  (pmVar10->tbs).len = (long)pbVar12 - (long)(pmVar10->tbs).p;
  val = &pmVar10->version;
  local_d0 = __dest + (long)pbVar13;
  iVar3 = mbedtls_asn1_get_tag(&local_138,pbVar12,&len_2,0xa0);
  if (iVar3 == 0) {
    pbVar13 = local_138 + len_2;
    local_128 = pbVar12;
    iVar3 = mbedtls_asn1_get_int(&local_138,pbVar13,val);
    pbVar12 = local_128;
    if (iVar3 != 0) {
      iVar3 = iVar3 + -0x2200;
      goto LAB_0010c3ee;
    }
    if (local_138 == pbVar13) goto LAB_0010c3f3;
    iVar3 = -0x2266;
  }
  else {
    if (iVar3 == -0x62) {
      *val = 0;
    }
    else {
LAB_0010c3ee:
      if (iVar3 != 0) goto LAB_0010c42c;
    }
LAB_0010c3f3:
    iVar3 = mbedtls_x509_get_serial(&local_138,pbVar12,&pmVar10->serial);
    if (iVar3 == 0) {
      local_118 = val;
      iVar3 = mbedtls_x509_get_alg(&local_138,pbVar12,&pmVar10->sig_oid,&sig_params1);
      if (iVar3 == 0) {
        uVar11 = *local_118;
        *local_118 = uVar11 + 1;
        local_128 = pbVar12;
        if (2 < (int)uVar11) {
          mbedtls_x509_crt_free(pmVar10);
          iVar3 = -0x2580;
          goto LAB_0010c434;
        }
        iVar3 = mbedtls_x509_get_sig_alg
                          (&pmVar10->sig_oid,&sig_params1,&pmVar10->sig_md,&pmVar10->sig_pk,
                           &pmVar10->sig_opts);
        if (iVar3 == 0) {
          (pmVar10->issuer_raw).p = local_138;
          iVar3 = mbedtls_asn1_get_tag(&local_138,local_128,&len,0x30);
          if (iVar3 != 0) goto LAB_0010c34e;
          iVar3 = mbedtls_x509_get_name(&local_138,local_138 + len,&pmVar10->issuer);
          if (iVar3 == 0) {
            (pmVar10->issuer_raw).len = (long)local_138 - (long)(pmVar10->issuer_raw).p;
            iVar3 = mbedtls_asn1_get_tag(&local_138,local_128,&len_2,0x30);
            if (iVar3 == 0) {
              pbVar13 = local_138 + len_2;
              iVar3 = mbedtls_x509_get_time(&local_138,pbVar13,&local_130->valid_from);
              pmVar10 = local_130;
              if (((iVar3 == 0) &&
                  (iVar3 = mbedtls_x509_get_time(&local_138,pbVar13,&local_130->valid_to),
                  pmVar10 = local_130, iVar3 == 0)) && (iVar3 = -0x2466, local_138 == pbVar13))
              goto LAB_0010c544;
            }
            else {
              iVar3 = iVar3 + -0x2400;
              pmVar10 = local_130;
              if (iVar3 == 0) {
LAB_0010c544:
                (local_130->subject_raw).p = local_138;
                iVar3 = mbedtls_asn1_get_tag(&local_138,local_128,&len,0x30);
                pmVar10 = local_130;
                if (iVar3 != 0) goto LAB_0010c34e;
                if ((len == 0) ||
                   (iVar3 = mbedtls_x509_get_name(&local_138,local_138 + len,&local_130->subject),
                   pmVar10 = local_130, iVar3 == 0)) {
                  (local_130->subject_raw).len = (long)local_138 - (long)(local_130->subject_raw).p;
                  iVar3 = mbedtls_pk_parse_subpubkey(&local_138,local_128,&local_130->pk);
                  pmVar10 = local_130;
                  if (iVar3 == 0) {
                    uVar11 = *local_118;
                    if ((uVar11 & 0xfffffffe) == 2) {
                      iVar3 = x509_get_uid(&local_138,local_128,&local_130->issuer_id,1);
                      pmVar10 = local_130;
                      if (iVar3 != 0) goto LAB_0010c42c;
                      uVar11 = *local_118;
                    }
                    if ((uVar11 & 0xfffffffe) == 2) {
                      iVar3 = x509_get_uid(&local_138,local_128,&local_130->subject_id,2);
                      pmVar10 = local_130;
                      if (iVar3 != 0) goto LAB_0010c42c;
                      if ((*local_118 == 3) &&
                         (iVar3 = mbedtls_x509_get_ext(&local_138,local_128,&local_130->v3_ext,3),
                         iVar3 != -0x62)) {
                        if (iVar3 == 0) {
                          pmVar1 = &local_130->subject_alt_names;
                          cur = &local_130->ext_key_usage;
                          local_118 = &local_130->ca_istrue;
                          local_d8 = &local_130->max_pathlen;
LAB_0010c708:
                          do {
                            if (local_128 <= local_138) {
                              if (local_138 == local_128) goto LAB_0010cbaf;
                              iVar3 = -0x2566;
                              pmVar10 = local_130;
                              goto LAB_0010c42c;
                            }
                            extn_oid.p = (uchar *)0x0;
                            is_critical = 0;
                            extn_oid.tag = 0;
                            extn_oid._4_4_ = 0;
                            extn_oid.len = 0;
                            local_100 = 0;
                            iVar3 = mbedtls_asn1_get_tag(&local_138,local_128,&len_1,0x30);
                            if (iVar3 != 0) {
LAB_0010cb61:
                              iVar3 = iVar3 + -0x2500;
                              goto LAB_0010cba6;
                            }
                            pbVar13 = local_138 + len_1;
                            extn_oid.tag = (uint)*local_138;
                            iVar3 = mbedtls_asn1_get_tag(&local_138,local_128,&extn_oid.len,6);
                            if (iVar3 != 0) goto LAB_0010cb61;
                            extn_oid.p = local_138;
                            local_138 = local_138 + extn_oid.len;
                            if (local_128 == local_138 || (long)local_128 - (long)local_138 < 0) {
                              iVar3 = -0x2560;
                              goto LAB_0010cba6;
                            }
                            iVar3 = mbedtls_asn1_get_bool(&local_138,pbVar13,&is_critical);
                            if (((iVar3 != -0x62) && (iVar3 != 0)) ||
                               (iVar3 = mbedtls_asn1_get_tag(&local_138,pbVar13,&len_1,4),
                               iVar3 != 0)) goto LAB_0010cb61;
                            pbVar12 = local_138 + len_1;
                            iVar3 = -0x2566;
                            if (pbVar12 != pbVar13) goto LAB_0010cba6;
                            iVar3 = mbedtls_oid_get_x509_ext_type(&extn_oid,(int *)&local_100);
                            if (iVar3 == 0) {
                              if ((local_100 & local_130->ext_types) != 0) {
                                iVar3 = -0x2500;
                                goto LAB_0010cba6;
                              }
                              local_130->ext_types = local_130->ext_types | local_100;
                              if (local_100 == 4) {
                                len_2 = 0;
                                uStack_f0 = '\0';
                                uStack_ef = 0;
                                local_e8 = (byte *)0x0;
                                iVar4 = mbedtls_asn1_get_bitstring
                                                  (&local_138,pbVar12,
                                                   (mbedtls_asn1_bitstring *)&len_2);
                                if (iVar4 == 0) {
                                  if (len_2 == 0) goto LAB_0010cc8d;
                                  local_130->key_usage = 0;
                                  sVar7 = len_2;
                                  if (3 < len_2) {
                                    sVar7 = 4;
                                  }
                                  uVar11 = 0;
                                  pbVar13 = local_e8;
                                  for (uVar9 = 0; (uint)((int)sVar7 << 3) != uVar9;
                                      uVar9 = uVar9 + 8) {
                                    uVar11 = uVar11 | (uint)*pbVar13 << ((byte)uVar9 & 0x1f);
                                    local_130->key_usage = uVar11;
                                    pbVar13 = pbVar13 + 1;
                                  }
                                  goto LAB_0010c708;
                                }
                              }
                              else if (local_100 == 0x20) {
                                iVar4 = mbedtls_asn1_get_tag(&local_138,pbVar12,&len_2,0x30);
                                if (iVar4 == 0) {
                                  local_11c = -0x2566;
                                  iVar3 = local_11c;
                                  pmVar8 = pmVar1;
                                  if (local_138 + len_2 != pbVar13) goto LAB_0010cba6;
                                  while (local_108 = pmVar8, local_138 < pbVar13) {
                                    if (pbVar13 == local_138 || (long)pbVar13 - (long)local_138 < 0)
                                    {
                                      local_11c = -0x2560;
                                      iVar3 = local_11c;
                                      goto LAB_0010cba6;
                                    }
                                    bVar2 = *local_138;
                                    local_138 = local_138 + 1;
                                    iVar4 = mbedtls_asn1_get_len(&local_138,pbVar12,&local_c0);
                                    if (iVar4 != 0) goto LAB_0010cb22;
                                    if (-1 < (char)bVar2) {
                                      local_11c = -0x2562;
                                      iVar3 = local_11c;
                                      goto LAB_0010cba6;
                                    }
                                    if (bVar2 == 0x82) {
                                      if ((local_108->buf).p != (uchar *)0x0) {
                                        if (local_108->next != (mbedtls_asn1_sequence *)0x0) {
                                          local_11c = -0x2500;
                                          iVar3 = local_11c;
                                          goto LAB_0010cba6;
                                        }
                                        pmVar8 = (mbedtls_asn1_sequence *)calloc(1,0x20);
                                        local_108->next = pmVar8;
                                        local_108 = pmVar8;
                                        if (pmVar8 == (mbedtls_asn1_sequence *)0x0) {
                                          local_11c = -0x256a;
                                          iVar3 = local_11c;
                                          goto LAB_0010cba6;
                                        }
                                      }
                                      (local_108->buf).tag = 0x82;
                                      (local_108->buf).p = local_138;
                                      (local_108->buf).len = local_c0;
                                      local_138 = local_138 + local_c0;
                                      pmVar8 = local_108;
                                    }
                                    else {
                                      local_138 = local_138 + local_c0;
                                      pmVar8 = local_108;
                                    }
                                  }
                                  local_108->next = (mbedtls_asn1_sequence *)0x0;
                                  iVar3 = local_11c;
                                  if (local_138 != pbVar13) goto LAB_0010cba6;
                                  goto LAB_0010c708;
                                }
                              }
                              else if (local_100 == 0x10000) {
                                len_2 = 0;
                                uStack_f0 = '\0';
                                uStack_ef = 0;
                                local_e8 = (byte *)0x0;
                                iVar4 = mbedtls_asn1_get_bitstring
                                                  (&local_138,pbVar12,
                                                   (mbedtls_asn1_bitstring *)&len_2);
                                if (iVar4 == 0) {
                                  if (len_2 != 1) {
LAB_0010cc8d:
                                    iVar3 = -0x2564;
                                    goto LAB_0010cba6;
                                  }
                                  local_130->ns_cert_type = *local_e8;
                                  goto LAB_0010c708;
                                }
                              }
                              else if (local_100 == 0x800) {
                                iVar4 = mbedtls_asn1_get_sequence_of(&local_138,pbVar12,cur,6);
                                if (iVar4 == 0) {
                                  if ((local_130->ext_key_usage).buf.p == (uchar *)0x0)
                                  goto LAB_0010cc8d;
                                  goto LAB_0010c708;
                                }
                              }
                              else {
                                if (local_100 != 0x100) {
                                  iVar3 = -0x2080;
                                  goto LAB_0010cba6;
                                }
                                *local_118 = 0;
                                *local_d8 = 0;
                                iVar4 = mbedtls_asn1_get_tag(&local_138,pbVar12,&len_2,0x30);
                                if (iVar4 == 0) {
                                  if (local_138 == pbVar13) goto LAB_0010c708;
                                  iVar4 = mbedtls_asn1_get_bool(&local_138,pbVar12,local_118);
                                  if (iVar4 != 0) {
                                    if (iVar4 == -0x62) {
                                      iVar4 = mbedtls_asn1_get_int(&local_138,pbVar12,local_118);
                                    }
                                    if (iVar4 != 0) goto LAB_0010cb22;
                                    if (*local_118 != 0) {
                                      *local_118 = 1;
                                    }
                                  }
                                  if (local_138 == pbVar13) goto LAB_0010c708;
                                  iVar4 = mbedtls_asn1_get_int(&local_138,pbVar12,local_d8);
                                  if (iVar4 == 0) {
                                    if (local_138 != pbVar13) {
                                      iVar3 = -0x2566;
                                      goto LAB_0010cba6;
                                    }
                                    *local_d8 = *local_d8 + 1;
                                    goto LAB_0010c708;
                                  }
                                }
                              }
LAB_0010cb22:
                              iVar3 = iVar4 + -0x2500;
                              if (iVar4 + -0x2500 != 0) goto LAB_0010cba6;
                              goto LAB_0010c708;
                            }
                            local_138 = pbVar12;
                          } while (is_critical == 0);
                          iVar3 = -0x2562;
                        }
LAB_0010cba6:
                        pmVar10 = local_130;
                        if (iVar3 != 0) goto LAB_0010c42c;
                      }
                    }
LAB_0010cbaf:
                    if (local_138 != local_128) {
LAB_0010c2c7:
                      pmVar10 = local_130;
                      mbedtls_x509_crt_free(local_130);
                      iVar3 = -0x21e6;
                      goto LAB_0010c434;
                    }
                    iVar3 = mbedtls_x509_get_alg(&local_138,local_d0,&local_68,&sig_params2);
                    pmVar10 = local_130;
                    if (iVar3 == 0) {
                      __n = (local_130->sig_oid).len;
                      if (((__n != local_68.len) ||
                          (iVar3 = bcmp((local_130->sig_oid).p,local_68.p,__n), iVar3 != 0)) ||
                         ((sig_params1.len != sig_params2.len ||
                          ((sig_params1.len != 0 &&
                           (iVar3 = bcmp(sig_params1.p,sig_params2.p,sig_params1.len), iVar3 != 0)))
                          ))) {
                        pmVar10 = local_130;
                        mbedtls_x509_crt_free(local_130);
                        iVar3 = -0x2680;
                        goto LAB_0010c434;
                      }
                      iVar3 = mbedtls_x509_get_sig(&local_138,local_d0,&local_130->sig);
                      pmVar10 = local_130;
                      if (iVar3 == 0) {
                        if (local_138 == local_d0) {
                          return 0;
                        }
                        goto LAB_0010c2c7;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0010c42c:
  mbedtls_x509_crt_free(pmVar10);
LAB_0010c434:
  if (pmVar5 != (mbedtls_x509_crt *)0x0) {
    pmVar5->next = (mbedtls_x509_crt *)0x0;
  }
  if (pmVar10 != chain) {
    free(pmVar10);
  }
  return iVar3;
}

Assistant:

int mbedtls_x509_crt_parse_der( mbedtls_x509_crt *chain, const unsigned char *buf,
                        size_t buflen )
{
    int ret;
    mbedtls_x509_crt *crt = chain, *prev = NULL;

    /*
     * Check for valid input
     */
    if( crt == NULL || buf == NULL )
        return( MBEDTLS_ERR_X509_BAD_INPUT_DATA );

    while( crt->version != 0 && crt->next != NULL )
    {
        prev = crt;
        crt = crt->next;
    }

    /*
     * Add new certificate on the end of the chain if needed.
     */
    if( crt->version != 0 && crt->next == NULL )
    {
        crt->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_crt ) );

        if( crt->next == NULL )
            return( MBEDTLS_ERR_X509_ALLOC_FAILED );

        prev = crt;
        mbedtls_x509_crt_init( crt->next );
        crt = crt->next;
    }

    if( ( ret = x509_crt_parse_der_core( crt, buf, buflen ) ) != 0 )
    {
        if( prev )
            prev->next = NULL;

        if( crt != chain )
            mbedtls_free( crt );

        return( ret );
    }

    return( 0 );
}